

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  int rtperr;
  ostream *poVar3;
  RTPPacket *p;
  uint16_t portbase;
  int num;
  RTPTime RStack_10918;
  string ipstr;
  RTPUDPv4TransmissionParams RStack_108f0;
  RTPSessionParams sessparams;
  MyRTPSession sess;
  
  MyRTPSession::MyRTPSession(&sess);
  ipstr._M_dataplus._M_p = (pointer)&ipstr.field_2;
  ipstr._M_string_length = 0;
  ipstr.field_2._M_local_buf[0] = '\0';
  poVar3 = std::operator<<((ostream *)&std::cout,"Enter local portbase:");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<((ostream *)&std::cout,"Number of seconds you wish to wait:");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::istream::operator>>((istream *)&std::cin,&num);
  RStack_108f0.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&RStack_108f0.localIPs;
  RStack_108f0.super_RTPTransmissionParams.protocol = IPv4UDPProto;
  RStack_108f0.super_RTPTransmissionParams._vptr_RTPTransmissionParams =
       (_func_int **)&PTR__RTPUDPv4TransmissionParams_00144040;
  RStack_108f0.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  _M_node._M_size = 0;
  RStack_108f0.super_RTPTransmissionParams._12_2_ = 5000;
  RStack_108f0.bindIP = 0;
  RStack_108f0.mcastifaceIP = 0;
  RStack_108f0.multicastTTL = '\x01';
  RStack_108f0.rtpsendbuf = 0x8000;
  RStack_108f0.rtprecvbuf = 0x8000;
  RStack_108f0.rtcpsendbuf = 0x8000;
  RStack_108f0.rtcprecvbuf = 0x8000;
  RStack_108f0.m_pAbortDesc = (RTPAbortDescriptors *)0x0;
  RStack_108f0._68_5_ = 0;
  RStack_108f0.rtpsock._1_3_ = 0;
  RStack_108f0.rtcpsock = 0;
  RStack_108f0.useexistingsockets = false;
  RStack_108f0.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       RStack_108f0.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  jrtplib::RTPSessionParams::RTPSessionParams(&sessparams);
  sessparams.owntsunit = 0.000125;
  sessparams.acceptown = true;
  iVar2 = jrtplib::RTPSession::Create
                    (&sess.super_RTPSession,&sessparams,&RStack_108f0.super_RTPTransmissionParams,
                     IPv4UDPProto);
  checkerror(iVar2);
  for (iVar2 = 1; iVar2 <= num; iVar2 = iVar2 + 1) {
    jrtplib::RTPSession::BeginDataAccess(&sess.super_RTPSession);
    bVar1 = jrtplib::RTPSession::GotoFirstSourceWithData(&sess.super_RTPSession);
    while (bVar1 != false) {
      while( true ) {
        p = jrtplib::RTPSession::GetNextPacket(&sess.super_RTPSession);
        if (p == (RTPPacket *)0x0) break;
        puts("Got packet !");
        jrtplib::RTPSession::DeletePacket(&sess.super_RTPSession,p);
      }
      bVar1 = jrtplib::RTPSession::GotoNextSourceWithData(&sess.super_RTPSession);
    }
    jrtplib::RTPSession::EndDataAccess(&sess.super_RTPSession);
    rtperr = jrtplib::RTPSession::Poll(&sess.super_RTPSession);
    checkerror(rtperr);
    RStack_10918.m_t = 1.0;
    jrtplib::RTPTime::Wait(&RStack_10918);
  }
  RStack_10918.m_t = 10.0;
  jrtplib::RTPSession::BYEDestroy(&sess.super_RTPSession,&RStack_10918,(void *)0x0,0);
  std::__cxx11::string::~string((string *)&sessparams.cname);
  jrtplib::RTPUDPv4TransmissionParams::~RTPUDPv4TransmissionParams(&RStack_108f0);
  std::__cxx11::string::~string((string *)&ipstr);
  jrtplib::RTPSession::~RTPSession(&sess.super_RTPSession);
  return 0;
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
	
	MyRTPSession sess;
	uint16_t portbase;
	std::string ipstr;
	int status,i,num;

        // First, we'll ask for the necessary information
		
	std::cout << "Enter local portbase:" << std::endl;
	std::cin >> portbase;
	std::cout << std::endl;
	
	std::cout << std::endl;
	std::cout << "Number of seconds you wish to wait:" << std::endl;
	std::cin >> num;
	
	// Now, we'll create a RTP session, set the destination
	// and poll for incoming data.
	
	RTPUDPv4TransmissionParams transparams;
	RTPSessionParams sessparams;
	
	// IMPORTANT: The local timestamp unit MUST be set, otherwise
	//            RTCP Sender Report info will be calculated wrong
	// In this case, we'll be just use 8000 samples per second.
	sessparams.SetOwnTimestampUnit(1.0/8000.0);		
	
	sessparams.SetAcceptOwnPackets(true);
	transparams.SetPortbase(portbase);
	status = sess.Create(sessparams,&transparams);	
	checkerror(status);
	
	for (i = 1 ; i <= num ; i++)
	{
		sess.BeginDataAccess();
		
		// check incoming packets
		if (sess.GotoFirstSourceWithData())
		{
			do
			{
				RTPPacket *pack;
				
				while ((pack = sess.GetNextPacket()) != NULL)
				{
					// You can examine the data here
					printf("Got packet !\n");
					
					// we don't longer need the packet, so
					// we'll delete it
					sess.DeletePacket(pack);
				}
			} while (sess.GotoNextSourceWithData());
		}
		
		sess.EndDataAccess();

#ifndef RTP_SUPPORT_THREAD
		status = sess.Poll();
		checkerror(status);
#endif // RTP_SUPPORT_THREAD
		
		RTPTime::Wait(RTPTime(1,0));
	}
	
	sess.BYEDestroy(RTPTime(10,0),0,0);

#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}